

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::findPreviousCompBoundary
          (Normalizer2Impl *this,UChar *start,UChar *p,UBool onlyContiguous)

{
  UChar UVar1;
  ushort uVar2;
  UCPTrie *trie;
  int iVar3;
  bool bVar4;
  UChar *unaff_RBX;
  uint c;
  UChar *pUVar5;
  
  do {
    if (p == start) {
      return p;
    }
    pUVar5 = p + -1;
    UVar1 = p[-1];
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if ((pUVar5 == start || ((ushort)UVar1 >> 10 & 1) == 0) || ((p[-2] & 0xfc00U) != 0xd800)) {
        iVar3 = this->normTrie->dataLength + -1;
      }
      else {
        pUVar5 = p + -2;
        c = c + (uint)(ushort)p[-2] * 0x400 + 0xfca02400;
        trie = this->normTrie;
        if ((int)c < trie->highStart) {
          iVar3 = ucptrie_internalSmallIndex_63(trie,c);
        }
        else {
          iVar3 = trie->dataLength + -2;
        }
      }
    }
    else {
      iVar3 = (c & 0x3f) + (uint)this->normTrie->index[(ushort)UVar1 >> 6];
    }
    uVar2 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar3 * 2);
    if ((uVar2 & 1) == 0) {
LAB_001a95dd:
      bVar4 = false;
      if (((int)(uint)(ushort)this->minCompNoMaybeCP <= (int)c) &&
         (bVar4 = false, this->minNoNoCompNoMaybeCC <= uVar2)) {
        bVar4 = this->minMaybeYes <= uVar2 || uVar2 < this->limitNoNo;
      }
      p = unaff_RBX;
      if (!bVar4) {
        p = pUVar5;
      }
    }
    else {
      bVar4 = false;
      if ((onlyContiguous != '\0') && (uVar2 != 1)) {
        if (uVar2 < this->limitNoNo) {
          bVar4 = *(ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffffffe)) < 0x200;
        }
        else {
          bVar4 = (uVar2 & 6) < 3;
        }
        if (!bVar4) goto LAB_001a95dd;
        bVar4 = false;
      }
    }
    unaff_RBX = p;
    p = pUVar5;
    if (!bVar4) {
      return unaff_RBX;
    }
  } while( true );
}

Assistant:

const UChar *Normalizer2Impl::findPreviousCompBoundary(const UChar *start, const UChar *p,
                                                       UBool onlyContiguous) const {
    while (p != start) {
        const UChar *codePointLimit = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
        if (norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return codePointLimit;
        }
        if (hasCompBoundaryBefore(c, norm16)) {
            return p;
        }
    }
    return p;
}